

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeHulls.cpp
# Opt level: O3

void __thiscall
HACD::ChUll::ChUll(ChUll *this,HaU32 vcount,HaF32 *vertices,HaU32 tcount,HaU32 *indices,HaU32 guid)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  HaF32 *vertices_00;
  HaU32 *indices_00;
  int iVar5;
  float *pfVar6;
  HaF32 HVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  HaF32 HVar11;
  undefined1 auVar12 [64];
  HaF32 HVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  this->mGuid = guid;
  this->mVertexCount = vcount;
  this->mTriangleCount = tcount;
  vertices_00 = (HaF32 *)malloc((ulong)vcount * 0xc);
  this->mVertices = vertices_00;
  memcpy(vertices_00,vertices,(ulong)vcount * 0xc);
  indices_00 = (HaU32 *)malloc((ulong)tcount * 0xc);
  this->mIndices = indices_00;
  memcpy(indices_00,indices,(ulong)tcount * 0xc);
  HVar7 = fm_computeMeshVolume(vertices_00,tcount,indices_00);
  this->mVolume = HVar7;
  HVar7 = *vertices_00;
  auVar10 = ZEXT464((uint)HVar7);
  HVar13 = vertices_00[1];
  auVar9 = ZEXT464((uint)HVar13);
  HVar11 = vertices_00[2];
  auVar8 = ZEXT464((uint)HVar11);
  if (1 < vcount) {
    pfVar6 = (float *)(vertices_00 + 5);
    iVar5 = vcount - 1;
    auVar12 = ZEXT464((uint)HVar11);
    auVar14 = ZEXT464((uint)HVar13);
    auVar15 = ZEXT464((uint)HVar7);
    do {
      fVar1 = pfVar6[-2];
      if (fVar1 < auVar15._0_4_) {
        auVar15 = ZEXT1664(ZEXT416((uint)fVar1));
        this->mMin[0] = (HaF32)fVar1;
      }
      HVar7 = auVar15._0_4_;
      fVar2 = pfVar6[-1];
      if (fVar2 < auVar14._0_4_) {
        auVar14 = ZEXT1664(ZEXT416((uint)fVar2));
        this->mMin[1] = (HaF32)fVar2;
      }
      HVar13 = auVar14._0_4_;
      fVar3 = *pfVar6;
      if (fVar3 < auVar12._0_4_) {
        auVar12 = ZEXT1664(ZEXT416((uint)fVar3));
        this->mMin[2] = (HaF32)fVar3;
      }
      HVar11 = auVar12._0_4_;
      auVar4 = vmaxss_avx(ZEXT416((uint)fVar1),auVar10._0_16_);
      auVar10 = ZEXT1664(auVar4);
      auVar4 = vmaxss_avx(ZEXT416((uint)fVar2),auVar9._0_16_);
      auVar9 = ZEXT1664(auVar4);
      auVar4 = vmaxss_avx(ZEXT416((uint)fVar3),auVar8._0_16_);
      auVar8 = ZEXT1664(auVar4);
      pfVar6 = pfVar6 + 3;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  fVar1 = auVar9._0_4_ - (float)HVar13;
  fVar2 = auVar10._0_4_ - (float)HVar7;
  fVar3 = auVar8._0_4_ - (float)HVar11;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar2))
  ;
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  this->mDiagonal = auVar4._0_4_;
  this->mMin[0] = (HaF32)((float)HVar7 - fVar2 * 0.1);
  this->mMin[1] = (HaF32)((float)HVar13 - fVar1 * 0.1);
  this->mMin[2] = (HaF32)((float)HVar11 - fVar3 * 0.1);
  this->mMax[0] = (HaF32)(auVar10._0_4_ + fVar2 * 0.1);
  this->mMax[1] = (HaF32)(auVar9._0_4_ + fVar1 * 0.1);
  this->mMax[2] = (HaF32)(fVar3 * 0.1 + auVar8._0_4_);
  return;
}

Assistant:

ChUll(HaU32 vcount,const HaF32 *vertices,HaU32 tcount,const HaU32 *indices,HaU32 guid)
		{
			mGuid = guid;
			mVertexCount = vcount;
			mTriangleCount = tcount;
			mVertices = (HaF32 *)HACD_ALLOC(sizeof(HaF32)*3*vcount);
			memcpy(mVertices,vertices,sizeof(HaF32)*3*vcount);
			mIndices = (HaU32 *)HACD_ALLOC(sizeof(HaU32)*3*tcount);
			memcpy(mIndices,indices,sizeof(HaU32)*3*tcount);
			mVolume = fm_computeMeshVolume( mVertices, mTriangleCount, mIndices);
			mDiagonal = fm_computeBestFitAABB( mVertexCount, mVertices, sizeof(hacd::HaF32)*3, mMin, mMax );
			hacd::HaF32 dx = mMax[0] - mMin[0];
			hacd::HaF32 dy = mMax[1] - mMin[1];
			hacd::HaF32 dz = mMax[2] - mMin[2];
			dx*=0.1f; // inflate 1/10th on each edge
			dy*=0.1f; // inflate 1/10th on each edge
			dz*=0.1f; // inflate 1/10th on each edge
			mMin[0]-=dx;
			mMin[1]-=dy;
			mMin[2]-=dz;
			mMax[0]+=dx;
			mMax[1]+=dy;
			mMax[2]+=dz;
		}